

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O3

void ResponseHandleParserEvent(HttpTestListener *req,int type,char *buf,int len)

{
  long lVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  char *__s;
  string *psVar4;
  ulong uVar5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec_query_pair;
  string str_pair;
  string query;
  http_parser_url url;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  long *local_f0 [2];
  long local_e0 [2];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long *local_b0 [2];
  long local_a0 [2];
  key_type local_90;
  long *local_70 [2];
  long local_60 [2];
  byte local_50 [20];
  ushort local_3c;
  
  switch(type) {
  case 2:
    std::__cxx11::string::_M_replace
              ((ulong)&req->request_url_,0,(char *)(req->request_url_)._M_string_length,(ulong)buf);
    http_parser_parse_url_(buf,(long)len,0,local_50);
    if ((local_50[0] & 0x10) != 0) {
      local_d0 = &local_c0;
      local_c8 = 0;
      local_c0 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)0x0,(ulong)(buf + local_3c));
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"&","");
      strsplit(&local_d0,&local_108,local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_108.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_108.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar6 = 8;
        uVar5 = 0;
        do {
          local_f0[0] = local_e0;
          lVar1 = *(long *)((long)local_108.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,lVar1,
                     *(long *)((long)&((local_108.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar6) + lVar1);
          std::__cxx11::string::find((char *)local_f0,0x1083de,0);
          std::__cxx11::string::substr((ulong)local_b0,(ulong)local_f0);
          std::__cxx11::string::substr((ulong)&local_90,(ulong)local_f0);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&req->map_request_query_,&local_90);
          std::__cxx11::string::operator=((string *)pmVar3,(string *)local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0],local_e0[0] + 1);
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x20;
        } while (uVar5 < (ulong)((long)local_108.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_108.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
    }
    break;
  case 3:
    if (req->is_last_value_ == true) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_request_header_,&req->last_request_field_);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      std::__cxx11::string::_M_replace
                ((ulong)&req->last_request_field_,0,
                 (char *)(req->last_request_field_)._M_string_length,0x1083ed);
      std::__cxx11::string::_M_replace
                ((ulong)&req->last_request_value_,0,
                 (char *)(req->last_request_value_)._M_string_length,0x1083ed);
    }
    std::__cxx11::string::append((char *)&req->last_request_field_,(ulong)buf);
    req->is_last_value_ = false;
    break;
  case 4:
    req->is_last_value_ = true;
    psVar4 = &req->last_request_value_;
    goto LAB_001068fb;
  case 5:
    if ((req->last_request_field_)._M_string_length != 0) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_request_header_,&req->last_request_field_);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      std::__cxx11::string::_M_replace
                ((ulong)&req->last_request_field_,0,
                 (char *)(req->last_request_field_)._M_string_length,0x1083ed);
      std::__cxx11::string::_M_replace
                ((ulong)&req->last_request_value_,0,
                 (char *)(req->last_request_value_)._M_string_length,0x1083ed);
    }
    __s = (char *)http_method_str_(req->parser_->method);
    pcVar2 = (char *)(req->request_method_)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&req->request_method_,0,pcVar2,(ulong)__s);
    return;
  case 6:
    psVar4 = &req->request_body_;
LAB_001068fb:
    std::__cxx11::string::append((char *)psVar4,(ulong)buf);
    return;
  case 7:
    req->is_request_complete_ = true;
  }
  return;
}

Assistant:

void ResponseHandleParserEvent(HttpTestListener* req, int type, char* buf, int len) {
  switch(type) {
  case PARSER_EVENT_URL: {
    req->request_url_.assign(buf, len);
    http_parser_url url;
    http_parser_parse_url_(buf, len, 0, &url);
    if(url.field_set & 1 << (UF_QUERY)) {
      std::string query;
      query.assign(&buf[url.field_data[UF_QUERY].off], url.field_data[UF_QUERY].len);
      std::vector<std::string> vec_query_pair;
      strsplit(query, vec_query_pair, "&");
      for(int i = 0; i < vec_query_pair.size(); i++) {
        std::string str_pair = vec_query_pair[i];
        int pos = str_pair.find("=");
        req->map_request_query_[str_pair.substr(0, pos)] = str_pair.substr(pos + 1, str_pair.size() - pos - 1);
      }
    }
    
    break;
  }
  case PARSER_EVENT_FIELD: {
    if(req->is_last_value_) {
      req->map_request_header_[req->last_request_field_] = req->last_request_value_;
      req->last_request_field_ = "";
      req->last_request_value_ = "";
    }
     req->last_request_field_.append(buf, len);
     req->is_last_value_ = false;
  }
    break;

  case PARSER_EVENT_VALUE: {
    req->is_last_value_ = true;
    req->last_request_value_.append(buf, len);
    break;
  }

  case PARSER_EVENT_HEADER_COMPLETE: {
    if(req->last_request_field_.size() > 0) {
      req->map_request_header_[req->last_request_field_] = req->last_request_value_;
      req->last_request_field_ = "";
      req->last_request_value_ = "";
    }

    req->request_method_ = http_method_str_((http_method)req->parser_->method);
    break;
  }
  case PARSER_EVENT_BODY: {
    req->request_body_.append(buf, len);
    break;
  }

  case PARSER_EVENT_MSG_COMPLETE: {
    req->is_request_complete_ = true;
    break;
  }
}

}